

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void __thiscall testing::internal::GTestLog::~GTestLog(GTestLog *this)

{
  ostream *this_00;
  GTestLog *in_RDI;
  
  this_00 = GetStream(in_RDI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if (in_RDI->severity_ == GTEST_FATAL) {
    fflush(_stderr);
    posix::Abort();
  }
  return;
}

Assistant:

GTestLog::~GTestLog() {
  GetStream() << ::std::endl;
  if (severity_ == GTEST_FATAL) {
    fflush(stderr);
    posix::Abort();
  }
}